

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::BufferID>::emplaceRealloc<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,pointer pos,BufferID *args)

{
  ulong uVar1;
  pointer p;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  
  if (this->len == 0x1fffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x1fffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0x1fffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  pBVar2 = (pointer)operator_new(uVar8 * 4);
  *(uint32_t *)((long)pBVar2 + lVar6) = args->id;
  p = this->data_;
  sVar7 = this->len;
  lVar5 = (long)p + (sVar7 * 4 - (long)pos);
  pBVar3 = p;
  pBVar4 = pBVar2;
  if (lVar5 == 0) {
    pBVar3 = pBVar2;
    pBVar4 = p;
    if (sVar7 != 0) {
      do {
        pBVar3->id = pBVar4->id;
        pBVar4 = pBVar4 + 1;
        pBVar3 = pBVar3 + 1;
      } while (pBVar4 != pos);
    }
  }
  else {
    for (; pBVar3 != pos; pBVar3 = pBVar3 + 1) {
      pBVar4->id = pBVar3->id;
      pBVar4 = pBVar4 + 1;
    }
    memcpy((void *)((long)pBVar2 + lVar6 + 4),pos,(lVar5 - 4U & 0xfffffffffffffffc) + 4);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pBVar2;
  return (pointer)((long)pBVar2 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}